

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  u64 nBytes;
  Fts3Table *p_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *__s2;
  sqlite3_int64 *psVar7;
  char *pcVar8;
  long *plVar9;
  void *p_01;
  undefined4 in_register_00000084;
  int *pnLoad;
  char *pcVar10;
  size_t __n;
  long lVar11;
  long *plVar12;
  int nSuffix;
  sqlite3_int64 iChild;
  int iHeight;
  uint local_94;
  char *local_90;
  void *local_88;
  int local_7c;
  long *local_78;
  int local_6c;
  Fts3Table *local_68;
  char *local_60;
  long *local_58;
  char *local_50;
  char *local_48;
  u64 local_40;
  long *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  local_78 = piLeaf;
  iVar3 = (int)*zNode;
  local_68 = p;
  local_60 = zTerm;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&local_6c);
    iVar3 = local_6c;
  }
  local_6c = iVar3;
  pcVar8 = zNode + nNode;
  iVar3 = sqlite3Fts3GetVarint(zNode,(sqlite_int64 *)&local_90);
  iVar4 = sqlite3Fts3GetVarint(zNode + iVar3,(sqlite_int64 *)&local_90);
  pcVar10 = zNode + iVar3 + iVar4;
  if (pcVar8 < pcVar10) {
    return 0x10b;
  }
  plVar9 = local_78;
  plVar12 = piLeaf2;
  if (pcVar10 < pcVar8) {
    bVar2 = false;
    local_40 = 0;
    local_88 = (void *)0x0;
    local_50 = pcVar8;
    local_48 = zNode;
    do {
      pcVar1 = local_48;
      pcVar8 = local_50;
      if (plVar9 == (long *)0x0 && plVar12 == (long *)0x0) {
        iVar3 = 0;
        p_01 = local_88;
        goto LAB_001c9fd1;
      }
      local_7c = 0;
      local_38 = plVar9;
      if (bVar2) {
        if (*pcVar10 < '\0') {
          uVar5 = sqlite3Fts3GetVarint32(pcVar10,&local_7c);
          uVar6 = (ulong)uVar5;
        }
        else {
          uVar6 = 1;
          local_7c = (int)*pcVar10;
        }
        pcVar10 = pcVar10 + uVar6;
      }
      local_58 = plVar12;
      if (*pcVar10 < '\0') {
        uVar5 = sqlite3Fts3GetVarint32(pcVar10,(int *)&local_94);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        local_94 = (int)*pcVar10;
      }
      iVar4 = local_7c;
      uVar5 = local_94;
      pcVar10 = pcVar10 + uVar6;
      lVar11 = (long)local_7c;
      iVar3 = 0x10b;
      p_01 = local_88;
      if ((((long)pcVar10 - (long)pcVar1 < lVar11) || (__n = (size_t)(int)local_94, __n == 0)) ||
         ((long)pcVar8 - (long)pcVar10 < (long)__n)) goto LAB_001c9fd1;
      __s2 = local_88;
      if ((long)local_40 < (long)(__n + lVar11)) {
        iVar3 = sqlite3_initialize();
        p_01 = local_88;
        if (iVar3 != 0) {
          iVar3 = 7;
          goto LAB_001c9fd1;
        }
        nBytes = (__n + lVar11) * 2;
        __s2 = sqlite3Realloc(local_88,nBytes);
        local_40 = nBytes;
        if (__s2 == (void *)0x0) {
          iVar3 = 7;
          goto LAB_001c9fd1;
        }
      }
      memcpy((void *)(lVar11 + (long)__s2),pcVar10,__n);
      iVar4 = iVar4 + uVar5;
      iVar3 = nTerm;
      if (iVar4 < nTerm) {
        iVar3 = iVar4;
      }
      local_88 = __s2;
      iVar3 = memcmp(local_60,__s2,(long)iVar3);
      plVar12 = local_58;
      if (local_38 == (long *)0x0) {
LAB_001c9f34:
        if ((local_58 == (long *)0x0) || (-1 < iVar3)) {
          plVar9 = (long *)0x0;
        }
        else {
          *local_58 = (long)local_90;
          plVar9 = (long *)0x0;
          plVar12 = (long *)0x0;
        }
      }
      else if ((iVar3 < 0) || (plVar9 = local_38, nTerm < iVar4 && iVar3 == 0)) {
        *local_38 = (long)local_90;
        goto LAB_001c9f34;
      }
      pcVar10 = pcVar10 + __n;
      local_90 = local_90 + 1;
      bVar2 = true;
    } while (pcVar10 < local_50);
  }
  else {
    local_88 = (void *)0x0;
  }
  if (plVar9 != (long *)0x0) {
    *plVar9 = (long)local_90;
  }
  iVar3 = 0;
  p_01 = local_88;
  if (plVar12 != (long *)0x0) {
    *plVar12 = (long)local_90;
  }
LAB_001c9fd1:
  p_00 = local_68;
  plVar9 = local_78;
  sqlite3_free(p_01);
  if (iVar3 != 0) {
    return iVar3;
  }
  if (local_6c < 2) {
    return 0;
  }
  local_90 = (char *)0x0;
  local_94 = 0;
  if ((piLeaf2 != (sqlite3_int64 *)0x0 && plVar9 != (sqlite3_int64 *)0x0) && (*plVar9 != *piLeaf2))
  {
    iVar3 = sqlite3Fts3ReadBlock(p_00,*plVar9,&local_90,(int *)&local_94,pnLoad);
    if (iVar3 == 0) {
      pnLoad = (int *)(ulong)local_94;
      iVar3 = fts3SelectLeaf(p_00,local_60,nTerm,local_90,local_94,plVar9,(sqlite3_int64 *)0x0);
    }
    sqlite3_free(local_90);
    local_90 = (char *)0x0;
    plVar9 = (sqlite3_int64 *)0x0;
    if (iVar3 != 0) goto LAB_001ca0d9;
  }
  local_90 = (char *)0x0;
  psVar7 = plVar9;
  if (plVar9 == (sqlite3_int64 *)0x0) {
    psVar7 = piLeaf2;
  }
  iVar3 = sqlite3Fts3ReadBlock(p_00,*psVar7,&local_90,(int *)&local_94,pnLoad);
  if (iVar3 == 0) {
    iVar3 = fts3SelectLeaf(p_00,local_60,nTerm,local_90,local_94,plVar9,piLeaf2);
  }
LAB_001ca0d9:
  sqlite3_free(local_90);
  return iVar3;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}